

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Type * __thiscall hdc::Parser::parse_type(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  IntType *this_00;
  IntType *pIVar3;
  PointerType *this_01;
  Expression *expression;
  
  bVar1 = match(this,TK_INT);
  if (bVar1) {
    this_00 = (IntType *)operator_new(0x78);
    IntType::IntType(this_00,(this->matched)._M_current);
  }
  else {
    bVar1 = match(this,TK_UINT);
    if (bVar1) {
      this_00 = (IntType *)operator_new(0x78);
      UIntType::UIntType((UIntType *)this_00,(this->matched)._M_current);
    }
    else {
      bVar1 = match(this,TK_FLOAT);
      if (bVar1) {
        this_00 = (IntType *)operator_new(0x78);
        FloatType::FloatType((FloatType *)this_00,(this->matched)._M_current);
      }
      else {
        bVar1 = match(this,TK_DOUBLE);
        if (bVar1) {
          this_00 = (IntType *)operator_new(0x78);
          DoubleType::DoubleType((DoubleType *)this_00,(this->matched)._M_current);
        }
        else {
          bVar1 = match(this,TK_SHORT);
          if (bVar1) {
            this_00 = (IntType *)operator_new(0x78);
            ShortType::ShortType((ShortType *)this_00,(this->matched)._M_current);
          }
          else {
            bVar1 = match(this,TK_USHORT);
            if (bVar1) {
              this_00 = (IntType *)operator_new(0x78);
              UShortType::UShortType((UShortType *)this_00,(this->matched)._M_current);
            }
            else {
              bVar1 = match(this,TK_LONG);
              if (bVar1) {
                this_00 = (IntType *)operator_new(0x78);
                LongType::LongType((LongType *)this_00,(this->matched)._M_current);
              }
              else {
                bVar1 = match(this,TK_ULONG);
                if (bVar1) {
                  this_00 = (IntType *)operator_new(0x78);
                  ULongType::ULongType((ULongType *)this_00,(this->matched)._M_current);
                }
                else {
                  bVar1 = match(this,TK_CHAR);
                  if (bVar1) {
                    this_00 = (IntType *)operator_new(0x78);
                    CharType::CharType((CharType *)this_00,(this->matched)._M_current);
                  }
                  else {
                    bVar1 = match(this,TK_UCHAR);
                    if (bVar1) {
                      this_00 = (IntType *)operator_new(0x78);
                      UCharType::UCharType((UCharType *)this_00,(this->matched)._M_current);
                    }
                    else {
                      bVar1 = match(this,TK_SYMBOL);
                      if (bVar1) {
                        this_00 = (IntType *)operator_new(0x78);
                        SymbolType::SymbolType((SymbolType *)this_00,(this->matched)._M_current);
                      }
                      else {
                        bVar1 = match(this,TK_VOID);
                        if (bVar1) {
                          this_00 = (IntType *)operator_new(0x78);
                          VoidType::VoidType((VoidType *)this_00,(this->matched)._M_current);
                        }
                        else {
                          bVar1 = match(this,TK_BOOL);
                          if (bVar1) {
                            this_00 = (IntType *)operator_new(0x78);
                            BoolType::BoolType((BoolType *)this_00,(this->matched)._M_current);
                          }
                          else {
                            bVar1 = match(this,TK_I8);
                            if (bVar1) {
                              this_00 = (IntType *)operator_new(0x78);
                              Int8Type::Int8Type((Int8Type *)this_00,(this->matched)._M_current);
                            }
                            else {
                              bVar1 = match(this,TK_I16);
                              if (bVar1) {
                                this_00 = (IntType *)operator_new(0x78);
                                Int16Type::Int16Type
                                          ((Int16Type *)this_00,(this->matched)._M_current);
                              }
                              else {
                                bVar1 = match(this,TK_I32);
                                if (bVar1) {
                                  this_00 = (IntType *)operator_new(0x78);
                                  Int32Type::Int32Type
                                            ((Int32Type *)this_00,(this->matched)._M_current);
                                }
                                else {
                                  bVar1 = match(this,TK_I64);
                                  if (bVar1) {
                                    this_00 = (IntType *)operator_new(0x78);
                                    Int64Type::Int64Type
                                              ((Int64Type *)this_00,(this->matched)._M_current);
                                  }
                                  else {
                                    bVar1 = match(this,TK_U8);
                                    if (bVar1) {
                                      this_00 = (IntType *)operator_new(0x78);
                                      UInt8Type::UInt8Type
                                                ((UInt8Type *)this_00,(this->matched)._M_current);
                                    }
                                    else {
                                      bVar1 = match(this,TK_U16);
                                      if (bVar1) {
                                        this_00 = (IntType *)operator_new(0x78);
                                        UInt16Type::UInt16Type
                                                  ((UInt16Type *)this_00,(this->matched)._M_current)
                                        ;
                                      }
                                      else {
                                        bVar1 = match(this,TK_U32);
                                        if (bVar1) {
                                          this_00 = (IntType *)operator_new(0x78);
                                          UInt32Type::UInt32Type
                                                    ((UInt32Type *)this_00,
                                                     (this->matched)._M_current);
                                        }
                                        else {
                                          bVar1 = match(this,TK_U64);
                                          if (bVar1) {
                                            this_00 = (IntType *)operator_new(0x78);
                                            UInt64Type::UInt64Type
                                                      ((UInt64Type *)this_00,
                                                       (this->matched)._M_current);
                                          }
                                          else {
                                            TVar2 = Token::getKind((this->current_token)._M_current)
                                            ;
                                            if (TVar2 == TK_ID) {
                                              this_00 = (IntType *)parse_named_type(this);
                                            }
                                            else {
                                              this_00 = (IntType *)0x0;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (this_00 != (IntType *)0x0) {
    while( true ) {
      while( true ) {
        while (bVar1 = match(this,TK_TIMES), bVar1) {
          pIVar3 = (IntType *)operator_new(0x50);
          PointerType::PointerType((PointerType *)pIVar3,(Type *)this_00,(this->matched)._M_current)
          ;
          this_00 = pIVar3;
        }
        bVar1 = match(this,TK_POWER);
        if (!bVar1) break;
        pIVar3 = (IntType *)operator_new(0x50);
        this_01 = (PointerType *)operator_new(0x50);
        PointerType::PointerType(this_01,(Type *)this_00,(this->matched)._M_current);
        PointerType::PointerType((PointerType *)pIVar3,(Type *)this_01,(this->matched)._M_current);
        this_00 = pIVar3;
      }
      bVar1 = match(this,TK_LEFT_SQUARE_BRACKET);
      if (!bVar1) break;
      bVar1 = match(this,TK_RIGHT_CURLY_BRACKET);
      if (bVar1) {
        pIVar3 = (IntType *)operator_new(0x58);
        ArrayType::ArrayType((ArrayType *)pIVar3,(Type *)this_00,(this->matched)._M_current);
        this_00 = pIVar3;
      }
      else {
        expression = parse_assignment_expression(this);
        expect(this,TK_RIGHT_SQUARE_BRACKET);
        pIVar3 = (IntType *)operator_new(0x58);
        ArrayType::ArrayType
                  ((ArrayType *)pIVar3,(Type *)this_00,expression,(this->matched)._M_current);
        this_00 = pIVar3;
      }
    }
  }
  return (Type *)this_00;
}

Assistant:

Type* Parser::parse_type() {
    Expression* expr = nullptr;
    Type* type = nullptr;

    if (match(TK_INT)) {
        type = new IntType(*matched);
    } else if (match(TK_UINT)) {
        type = new UIntType(*matched);
    } else if (match(TK_FLOAT)) {
        type = new FloatType(*matched);
    } else if (match(TK_DOUBLE)) {
        type = new DoubleType(*matched);
    } else if (match(TK_SHORT)) {
        type = new ShortType(*matched);
    } else if (match(TK_USHORT)) {
        type = new UShortType(*matched);
    } else if (match(TK_LONG)) {
        type = new LongType(*matched);
    } else if (match(TK_ULONG)) {
        type = new ULongType(*matched);
    } else if (match(TK_CHAR)) {
        type = new CharType(*matched);
    } else if (match(TK_UCHAR)) {
        type = new UCharType(*matched);
    } else if (match(TK_SYMBOL)) {
        type = new SymbolType(*matched);
    } else if (match(TK_VOID)) {
        type = new VoidType(*matched);
    } else if (match(TK_BOOL)) {
        type = new BoolType(*matched);
    } else if (match(TK_I8)) {
        type = new Int8Type(*matched);
    } else if (match(TK_I16)) {
        type = new Int16Type(*matched);
    } else if (match(TK_I32)) {
        type = new Int32Type(*matched);
    } else if (match(TK_I64)) {
        type = new Int64Type(*matched);
    } else if (match(TK_U8)) {
        type = new UInt8Type(*matched);
    } else if (match(TK_U16)) {
        type = new UInt16Type(*matched);
    } else if (match(TK_U32)) {
        type = new UInt32Type(*matched);
    } else if (match(TK_U64)) {
        type = new UInt64Type(*matched);
    } else if (lookahead(TK_ID)) {
        type = parse_named_type();
    }

    while (type != NULL) {
        if (match(TK_TIMES)) {
            type = new PointerType(type, *matched);
        } else if (match(TK_POWER)) {
            type = new PointerType(new PointerType(type, *matched), *matched);
        } else if (match(TK_LEFT_SQUARE_BRACKET)) {
            if (match(TK_RIGHT_CURLY_BRACKET)) {
                type = new ArrayType(type, *matched);
            } else {
                expr = parse_expression();
                expect(TK_RIGHT_SQUARE_BRACKET);
                type = new ArrayType(type, expr, *matched);
            }
        } else {
            break;
        }
    }

    return type;
}